

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsQuerySetQueryString(HelicsQuery query,char *queryString,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  HelicsQuery pvVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (query == (HelicsQuery)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019bab6;
    }
    else {
      bVar4 = *(int *)((long)query + 0x7c) == 0x27063885;
      pvVar3 = (HelicsQuery)0x0;
      if (bVar4) {
        pvVar3 = query;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_0019bab9;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
LAB_0019bab6:
  pvVar3 = (HelicsQuery)0x0;
LAB_0019bab9:
  if (pvVar3 != (HelicsQuery)0x0) {
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (queryString == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(queryString);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,queryString,queryString + sVar2);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pvVar3 + 0x20),&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsQuerySetQueryString(HelicsQuery query, const char* queryString, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->query = AS_STRING(queryString);
}